

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-stdio-over-pipes.c
# Opt level: O1

int stdio_over_pipes_helper(void)

{
  char *__s;
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  size_t sVar3;
  void *pvVar4;
  undefined8 *extraout_RDX;
  uv_pipe_t *in_RSI;
  uv_pipe_t *puVar5;
  code *__size;
  long lVar6;
  undefined1 *puVar7;
  undefined1 auVar8 [16];
  uv_buf_t buf [7];
  uv_write_t write_req [7];
  undefined8 local_5d8 [14];
  undefined1 local_568 [1344];
  
  uVar2 = uv_default_loop();
  iVar1 = uv_guess_handle(0);
  if (iVar1 == 7) {
    iVar1 = uv_guess_handle(1);
    __size = (code *)in_RSI;
    if (iVar1 != 7) goto LAB_0016f959;
    puVar5 = &stdin_pipe;
    iVar1 = uv_pipe_init(uVar2,&stdin_pipe,0);
    __size = (code *)puVar5;
    if (iVar1 != 0) goto LAB_0016f95e;
    puVar5 = &stdout_pipe;
    iVar1 = uv_pipe_init(uVar2,&stdout_pipe,0);
    __size = (code *)puVar5;
    if (iVar1 != 0) goto LAB_0016f963;
    lVar6 = 0;
    uv_pipe_open(&stdin_pipe,0);
    uv_pipe_open(&stdout_pipe,1);
    uv_unref(&stdin_pipe);
    uv_unref(&stdout_pipe);
    do {
      __s = *(char **)((long)&PTR_anon_var_dwarf_79325_001c8d70 + lVar6);
      sVar3 = strlen(__s);
      auVar8 = uv_buf_init(__s,sVar3 & 0xffffffff);
      *(long *)((long)local_5d8 + lVar6 * 2) = auVar8._0_8_;
      *(long *)((long)local_5d8 + lVar6 * 2 + 8) = auVar8._8_8_;
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0x38);
    puVar7 = local_568;
    lVar6 = 0;
    do {
      in_RSI = &stdout_pipe;
      iVar1 = uv_write(puVar7,&stdout_pipe,(long)local_5d8 + lVar6,1,after_pipe_write);
      if (iVar1 != 0) {
        stdio_over_pipes_helper_cold_5();
        goto LAB_0016f954;
      }
      lVar6 = lVar6 + 0x10;
      puVar7 = puVar7 + 0xc0;
    } while (lVar6 != 0x70);
    notify_parent_process();
    __size = (code *)0x0;
    uv_run(uVar2);
    if (after_write_called != 7) goto LAB_0016f968;
    if (on_pipe_read_called != 0) goto LAB_0016f96d;
    if (close_cb_called != 0) goto LAB_0016f972;
    uv_ref(&stdout_pipe);
    uv_ref(&stdin_pipe);
    __size = on_read_alloc;
    iVar1 = uv_read_start(&stdin_pipe,on_read_alloc,on_pipe_read);
    if (iVar1 != 0) goto LAB_0016f977;
    __size = (code *)0x0;
    uv_run(uVar2);
    if (after_write_called != 7) goto LAB_0016f97c;
    if (on_pipe_read_called != 1) goto LAB_0016f981;
    if (close_cb_called == 2) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      __size = (code *)0x0;
      uv_run(uVar2);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0016f98b;
    }
  }
  else {
LAB_0016f954:
    stdio_over_pipes_helper_cold_1();
    __size = (code *)in_RSI;
LAB_0016f959:
    stdio_over_pipes_helper_cold_2();
LAB_0016f95e:
    stdio_over_pipes_helper_cold_3();
LAB_0016f963:
    stdio_over_pipes_helper_cold_4();
LAB_0016f968:
    stdio_over_pipes_helper_cold_6();
LAB_0016f96d:
    stdio_over_pipes_helper_cold_7();
LAB_0016f972:
    stdio_over_pipes_helper_cold_8();
LAB_0016f977:
    stdio_over_pipes_helper_cold_9();
LAB_0016f97c:
    stdio_over_pipes_helper_cold_10();
LAB_0016f981:
    stdio_over_pipes_helper_cold_11();
  }
  stdio_over_pipes_helper_cold_12();
LAB_0016f98b:
  stdio_over_pipes_helper_cold_13();
  if ((int)__size == 0) {
    after_write_called = after_write_called + 1;
    return extraout_EAX;
  }
  after_pipe_write_cold_1();
  pvVar4 = malloc((size_t)__size);
  *extraout_RDX = pvVar4;
  extraout_RDX[1] = __size;
  return (int)pvVar4;
}

Assistant:

int stdio_over_pipes_helper(void) {
  /* Write several buffers to test that the write order is preserved. */
  char* buffers[] = {
    "he",
    "ll",
    "o ",
    "wo",
    "rl",
    "d",
    "\n"
  };

  uv_write_t write_req[ARRAY_SIZE(buffers)];
  uv_buf_t buf[ARRAY_SIZE(buffers)];
  unsigned int i;
  int r;
  uv_loop_t* loop = uv_default_loop();

  ASSERT(UV_NAMED_PIPE == uv_guess_handle(0));
  ASSERT(UV_NAMED_PIPE == uv_guess_handle(1));

  r = uv_pipe_init(loop, &stdin_pipe, 0);
  ASSERT(r == 0);
  r = uv_pipe_init(loop, &stdout_pipe, 0);
  ASSERT(r == 0);

  uv_pipe_open(&stdin_pipe, 0);
  uv_pipe_open(&stdout_pipe, 1);

  /* Unref both stdio handles to make sure that all writes complete. */
  uv_unref((uv_handle_t*)&stdin_pipe);
  uv_unref((uv_handle_t*)&stdout_pipe);

  for (i = 0; i < ARRAY_SIZE(buffers); i++) {
    buf[i] = uv_buf_init((char*)buffers[i], strlen(buffers[i]));
  }

  for (i = 0; i < ARRAY_SIZE(buffers); i++) {
    r = uv_write(&write_req[i], (uv_stream_t*)&stdout_pipe, &buf[i], 1,
      after_pipe_write);
    ASSERT(r == 0);
  }

  notify_parent_process();
  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(after_write_called == 7);
  ASSERT(on_pipe_read_called == 0);
  ASSERT(close_cb_called == 0);

  uv_ref((uv_handle_t*)&stdout_pipe);
  uv_ref((uv_handle_t*)&stdin_pipe);

  r = uv_read_start((uv_stream_t*)&stdin_pipe, on_read_alloc, on_pipe_read);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(after_write_called == 7);
  ASSERT(on_pipe_read_called == 1);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}